

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_mul_30
               (secp256k1_modinv32_signed30 *r,secp256k1_modinv32_signed30 *a,int alen,
               int32_t factor)

{
  secp256k1_scalar *a_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  secp256k1_modinv32_signed30 *psVar5;
  ulong uVar6;
  secp256k1_modinv32_signed30 *psVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  uint *extraout_RDX;
  int32_t *piVar11;
  long lVar12;
  secp256k1_modinv32_signed30 *b;
  ulong uVar13;
  long *extraout_RDX_00;
  secp256k1_fe *psVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  secp256k1_fe *psVar19;
  ulong uVar20;
  secp256k1_fe *psVar21;
  secp256k1_fe *r_00;
  secp256k1_modinv32_signed30 *a_01;
  long lVar22;
  ulong uVar23;
  secp256k1_fe *r_01;
  uchar *__s;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  secp256k1_modinv32_signed30 *psVar31;
  code *pcVar32;
  uint uVar33;
  secp256k1_modinv32_signed30 *psVar34;
  size_t count;
  uint uVar35;
  code *pcVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uStack_12c0;
  secp256k1_fe *psStack_12b8;
  uchar auStack_12b0 [4232];
  secp256k1_fe *psStack_228;
  code *pcStack_220;
  undefined8 uStack_218;
  secp256k1_fe *psStack_210;
  code *pcStack_208;
  code *pcStack_200;
  undefined1 auStack_1f8 [36];
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int iStack_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  undefined1 auStack_1b8 [48];
  code *pcStack_188;
  secp256k1_fe sStack_180;
  secp256k1_fe sStack_150;
  secp256k1_fe sStack_120;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  secp256k1_modinv32_signed30 *psStack_d0;
  ulong uStack_c8;
  code *pcStack_c0;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  secp256k1_modinv32_signed30 *psStack_a0;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  int32_t iStack_84;
  secp256k1_modinv32_signed30 *psStack_80;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_signed30 *psStack_70;
  secp256k1_modinv32_signed30 *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  code *pcStack_58;
  long lStack_48;
  long lStack_40;
  
  lVar28 = 0;
  psVar5 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar28 < alen) {
      psVar5 = (secp256k1_modinv32_signed30 *)((long)psVar5->v + (long)a->v[lVar28] * (long)factor);
    }
    r->v[lVar28] = (uint)psVar5 & 0x3fffffff;
    psVar5 = (secp256k1_modinv32_signed30 *)((long)psVar5 >> 0x1e);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 8);
  if (8 < alen) {
    psVar5 = (secp256k1_modinv32_signed30 *)((long)psVar5->v + (long)a->v[8] * (long)factor);
  }
  psVar7 = (secp256k1_modinv32_signed30 *)(long)(int)psVar5;
  if (psVar7 == psVar5) {
    r->v[8] = (int)psVar5;
    return;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar17 = *extraout_RDX;
  psVar34 = (secp256k1_modinv32_signed30 *)(long)(int)uVar17;
  uVar10 = extraout_RDX[1];
  lVar28 = (long)(int)uVar10;
  uVar18 = extraout_RDX[2];
  psVar5 = (secp256k1_modinv32_signed30 *)(long)(int)uVar18;
  lStack_48 = (long)(int)extraout_RDX[3];
  psVar19 = (secp256k1_fe *)0x9;
  pcStack_58 = (code *)0x155ac5;
  a_01 = r;
  iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,-2);
  if (iVar1 < 1) {
    pcStack_58 = (code *)0x155d2d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00155d2d:
    pcStack_58 = (code *)0x155d32;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00155d32:
    pcStack_58 = (code *)0x155d37;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00155d37:
    pcStack_58 = (code *)0x155d3c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_00155d3c:
    pcStack_58 = (code *)0x155d41;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00155d41:
    pcStack_58 = (code *)0x155d46;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00155d46:
    pcStack_58 = (code *)0x155d4b;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_00155d4b:
    pcStack_58 = (code *)0x155d50;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar31 = psVar7;
LAB_00155d50:
    pcStack_58 = (code *)0x155d55;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_00155d55:
    pcStack_58 = (code *)0x155d5a;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_00155d5a:
    pcStack_58 = (code *)0x155d5f;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x155ae2;
    a_01 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,1);
    if (-1 < iVar1) goto LAB_00155d2d;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x155aff;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,-2);
    if (iVar1 < 1) goto LAB_00155d32;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x155b1c;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,1);
    if (-1 < iVar1) goto LAB_00155d37;
    psVar31 = (secp256k1_modinv32_signed30 *)-(long)psVar34;
    if (0 < (long)psVar34) {
      psVar31 = psVar34;
    }
    lVar8 = -lVar28;
    if (lVar28 < 1) {
      lVar8 = lVar28;
    }
    if (lVar8 + 0x40000000 < (long)psVar31) goto LAB_00155d3c;
    psVar31 = (secp256k1_modinv32_signed30 *)-(long)psVar5;
    if (0 < (long)psVar5) {
      psVar31 = psVar5;
    }
    lVar8 = -lStack_48;
    if (lStack_48 < 1) {
      lVar8 = lStack_48;
    }
    if (lVar8 + 0x40000000 < (long)psVar31) goto LAB_00155d41;
    uVar24 = r->v[8] >> 0x1f;
    uVar16 = a->v[8] >> 0x1f;
    psVar19 = (secp256k1_fe *)(ulong)uVar16;
    iVar1 = (uVar16 & uVar10) + (uVar24 & uVar17);
    a_01 = (secp256k1_modinv32_signed30 *)(a->v[0] * lVar28 + (long)r->v[0] * (long)psVar34);
    lVar8 = (long)(int)(iVar1 - ((int)a_01 * psVar7[1].v[0] + iVar1 & 0x3fffffffU));
    piVar11 = (int32_t *)((long)a_01->v + lVar8 * psVar7->v[0]);
    if (((ulong)piVar11 & 0x3fffffff) != 0) goto LAB_00155d46;
    iVar1 = (uVar16 & (uint)lStack_48) + (uVar24 & uVar18);
    lVar29 = a->v[0] * lStack_48 + (long)r->v[0] * (long)psVar5;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar17 = iVar1 - (psVar7[1].v[0] * (int)lVar29 + iVar1 & 0x3fffffffU);
    psVar19 = (secp256k1_fe *)(ulong)uVar17;
    uVar6 = (long)psVar7->v[0] * (long)(int)uVar17 + lVar29;
    lStack_40 = lVar8;
    if ((uVar6 & 0x3fffffff) != 0) goto LAB_00155d4b;
    lVar29 = (long)uVar6 >> 0x1e;
    lVar12 = (long)piVar11 >> 0x1e;
    lVar22 = 1;
    do {
      lVar12 = psVar7->v[lVar22] * lVar8 + a->v[lVar22] * lVar28 +
               (long)r->v[lVar22] * (long)psVar34 + lVar12;
      psVar31 = (secp256k1_modinv32_signed30 *)(a->v[lVar22] * lStack_48);
      lVar29 = (long)psVar31->v +
               (long)r->v[lVar22] * (long)psVar5 + lVar29 +
               (long)psVar7->v[lVar22] * (long)(int)uVar17;
      r->v[lVar22 + -1] = (uint)lVar12 & 0x3fffffff;
      a->v[lVar22 + -1] = (uint)lVar29 & 0x3fffffff;
      lVar22 = lVar22 + 1;
      lVar29 = lVar29 >> 0x1e;
      lVar12 = lVar12 >> 0x1e;
    } while (lVar22 != 9);
    r->v[8] = (int32_t)lVar12;
    a->v[8] = (int32_t)lVar29;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x155cc6;
    a_01 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,-2);
    psVar5 = a;
    psVar34 = psVar7;
    if (iVar1 < 1) goto LAB_00155d50;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x155ce3;
    a_01 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,psVar7,1);
    if (-1 < iVar1) goto LAB_00155d55;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x155cfc;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,-2);
    if (iVar1 < 1) goto LAB_00155d5a;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x155d15;
    a_01 = a;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a,9,psVar7,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_58 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar17 = a_01->v[0];
  uVar23 = (ulong)uVar17;
  uVar10 = a_01->v[3];
  uVar20 = (ulong)uVar10;
  uVar18 = a_01->v[4];
  uVar15 = (ulong)uVar18;
  uVar16 = a_01->v[5];
  uVar13 = (ulong)uVar16;
  psVar7 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar24 = a_01->v[7];
  uVar6 = (ulong)uVar24;
  iStack_84 = a_01->v[8];
  lVar8 = 0;
  do {
    psStack_80 = psVar5;
    psStack_78 = psVar31;
    psStack_70 = psVar34;
    psStack_68 = a;
    psStack_60 = r;
    pcStack_58 = (code *)lVar28;
    if (a_01->v[lVar8] < -0x3fffffff) {
      pcStack_c0 = (code *)0x1560ad;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_001560ad:
      pcStack_c0 = (code *)0x1560b2;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_001560b2;
    }
    if (0x3fffffff < a_01->v[lVar8]) goto LAB_001560ad;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_a4 = (uint)psVar19;
  psVar19 = (secp256k1_fe *)0x9;
  pcStack_c0 = (code *)0x155dea;
  psVar7 = a_01;
  uStack_b0 = a_01->v[1];
  uStack_ac = a_01->v[2];
  uStack_a8 = a_01->v[6];
  psStack_a0 = b;
  iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar1 < 1) {
LAB_001560b2:
    pcStack_c0 = (code *)0x1560b7;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_001560b7:
    pcStack_c0 = (code *)0x1560bc;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_001560bc:
    pcStack_c0 = (code *)0x1560c1;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_001560c1:
    pcStack_c0 = (code *)0x1560c6;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x155e09;
    psVar7 = a_01;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,1);
    if (-1 < iVar1) goto LAB_001560b7;
    uVar2 = iStack_84 >> 0x1f;
    uStack_88 = psStack_a0->v[1];
    uVar3 = (uVar2 & uStack_88) + uStack_b0;
    uStack_b0 = psStack_a0->v[2];
    uVar9 = (uVar2 & uStack_b0) + uStack_ac;
    uStack_ac = psStack_a0->v[3];
    uStack_8c = psStack_a0->v[4];
    uStack_90 = psStack_a0->v[5];
    uStack_94 = psStack_a0->v[6];
    uVar33 = (uVar2 & uStack_94) + uStack_a8;
    uStack_a8 = psStack_a0->v[7];
    uStack_b4 = (int)uStack_a4 >> 0x1f;
    uStack_a4 = psStack_a0->v[8];
    uVar27 = ((uVar2 & psStack_a0->v[0]) + uVar17 ^ uStack_b4) - uStack_b4;
    uVar25 = ((int)uVar27 >> 0x1e) + ((uVar3 ^ uStack_b4) - uStack_b4);
    uVar3 = ((int)uVar25 >> 0x1e) + ((uVar9 ^ uStack_b4) - uStack_b4);
    uVar35 = ((int)uVar3 >> 0x1e) + (((uVar2 & uStack_ac) + uVar10 ^ uStack_b4) - uStack_b4);
    uVar10 = ((int)uVar35 >> 0x1e) + (((uVar2 & uStack_8c) + uVar18 ^ uStack_b4) - uStack_b4);
    uVar17 = ((int)uVar10 >> 0x1e) + (((uVar2 & uStack_90) + uVar16 ^ uStack_b4) - uStack_b4);
    uVar18 = ((int)uVar17 >> 0x1e) + ((uVar33 ^ uStack_b4) - uStack_b4);
    uVar16 = ((int)uVar18 >> 0x1e) + (((uVar2 & uStack_a8) + uVar24 ^ uStack_b4) - uStack_b4);
    uVar30 = ((int)uVar16 >> 0x1e) + (((uVar2 & uStack_a4) + iStack_84 ^ uStack_b4) - uStack_b4);
    uVar13 = (ulong)uVar30;
    uStack_b8 = (int)uVar30 >> 0x1f;
    uVar33 = (psStack_a0->v[0] & uStack_b8) + (uVar27 & 0x3fffffff);
    uVar9 = (uStack_90 & uStack_b8) + (uVar17 & 0x3fffffff);
    uVar23 = (ulong)uVar9;
    uVar27 = (uStack_94 & uStack_b8) + (uVar18 & 0x3fffffff);
    uVar20 = (ulong)uVar27;
    uVar17 = ((int)uVar33 >> 0x1e) + (uStack_88 & uStack_b8) + (uVar25 & 0x3fffffff);
    uVar18 = ((int)uVar17 >> 0x1e) + (uStack_b0 & uStack_b8) + (uVar3 & 0x3fffffff);
    uVar24 = ((int)uVar18 >> 0x1e) + (uStack_ac & uStack_b8) + (uVar35 & 0x3fffffff);
    uVar2 = ((int)uVar24 >> 0x1e) + (uStack_8c & uStack_b8) + (uVar10 & 0x3fffffff);
    uVar9 = ((int)uVar2 >> 0x1e) + uVar9;
    uVar27 = ((int)uVar9 >> 0x1e) + uVar27;
    uVar10 = ((int)uVar27 >> 0x1e) + (uStack_a8 & uStack_b8) + (uVar16 & 0x3fffffff);
    uVar16 = ((int)uVar10 >> 0x1e) + (uStack_a4 & uStack_b8) + uVar30;
    uVar15 = (ulong)uVar16;
    uVar24 = uVar24 & 0x3fffffff;
    psVar19 = (secp256k1_fe *)(ulong)uVar24;
    uVar2 = uVar2 & 0x3fffffff;
    psVar7 = (secp256k1_modinv32_signed30 *)(ulong)uVar2;
    uVar10 = uVar10 & 0x3fffffff;
    uVar6 = (ulong)uVar10;
    a_01->v[0] = uVar33 & 0x3fffffff;
    a_01->v[1] = uVar17 & 0x3fffffff;
    a_01->v[2] = uVar18 & 0x3fffffff;
    a_01->v[3] = uVar24;
    a_01->v[4] = uVar2;
    a_01->v[5] = uVar9 & 0x3fffffff;
    a_01->v[6] = uVar27 & 0x3fffffff;
    a_01->v[7] = uVar10;
    a_01->v[8] = uVar16;
    if (0x3fffffff < uVar16) goto LAB_001560bc;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x15607a;
    psVar7 = a_01;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,0);
    if (iVar1 < 0) goto LAB_001560c1;
    psVar19 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x156095;
    psVar7 = a_01;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_c0 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r_00 = &sStack_180;
  psVar14 = &sStack_180;
  pcVar32 = secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    pcVar32 = secp256k1_fe_inv;
  }
  pcStack_188 = (code *)0x1560fc;
  uStack_e8 = uVar6;
  uStack_e0 = uVar13;
  uStack_d8 = uVar20;
  psStack_d0 = a_01;
  uStack_c8 = uVar23;
  pcStack_c0 = (code *)uVar15;
  (*pcVar32)(&sStack_180);
  if (psVar7 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar7->v + 8) = sStack_180.n[4];
    *(ulong *)(psVar7[1].v + 1) = CONCAT44(sStack_180.normalized,sStack_180.magnitude);
    *(uint64_t *)(psVar7->v + 4) = sStack_180.n[2];
    *(uint64_t *)(psVar7->v + 6) = sStack_180.n[3];
    *(uint64_t *)psVar7->v = sStack_180.n[0];
    *(uint64_t *)(psVar7->v + 2) = sStack_180.n[1];
  }
  uVar15 = 0xffffffffffff;
  sStack_120.n[0] = psVar19->n[0];
  sStack_120.n[1] = psVar19->n[1];
  sStack_120.n[2] = psVar19->n[2];
  sStack_120.n[3] = psVar19->n[3];
  sStack_120.n[4] = psVar19->n[4];
  sStack_120.magnitude = psVar19->magnitude;
  sStack_120.normalized = psVar19->normalized;
  psVar21 = &sStack_120;
  pcStack_188 = (code *)0x156165;
  secp256k1_fe_verify(psVar21);
  uVar6 = (sStack_120.n[4] >> 0x30) * 0x1000003d1 + sStack_120.n[0];
  if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
    uVar13 = (uVar6 >> 0x34) + sStack_120.n[1];
    uVar20 = (uVar13 >> 0x34) + sStack_120.n[2];
    uVar23 = (uVar20 >> 0x34) + sStack_120.n[3];
    uVar26 = (uVar23 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
    if ((((uVar13 | uVar6 | uVar20 | uVar23) & 0xfffffffffffff) != 0 || uVar26 != 0) &&
       (((uVar6 | 0x1000003d0) & uVar13 & uVar20 & uVar23 & (uVar26 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015620c;
LAB_001565d6:
    pcStack_188 = (code *)0x1565e1;
    secp256k1_fe_verify(&sStack_180);
    uVar15 = sStack_180.n[4] & 0xffffffffffff;
    uVar6 = (sStack_180.n[4] >> 0x30) * 0x1000003d1 + sStack_180.n[0];
    uVar13 = (uVar6 >> 0x34) + sStack_180.n[1];
    uVar20 = (uVar13 >> 0x34) + sStack_180.n[2];
    r_00 = (secp256k1_fe *)((uVar20 >> 0x34) + sStack_180.n[3]);
    uVar23 = ((ulong)r_00 >> 0x34) + uVar15;
    if ((((uVar13 | uVar6 | uVar20 | (ulong)r_00) & 0xfffffffffffff) == 0 && uVar23 == 0) ||
       (r_01 = (secp256k1_fe *)(uVar23 ^ 0xf000000000000), psVar14 = &sStack_180,
       ((uVar6 ^ 0x1000003d0) & uVar13 & uVar20 & (ulong)r_00 & (ulong)r_01) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0015620c:
    pcStack_188 = (code *)0x15621f;
    psVar21 = psVar19;
    secp256k1_fe_mul(&sStack_120,psVar19,&sStack_180);
    pcStack_188 = (code *)0x156227;
    secp256k1_fe_verify(&sStack_120);
    r_01 = &fe_minus_one;
    pcStack_188 = (code *)0x156233;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_120.magnitude < 0x20) {
      sStack_120.n[0] = sStack_120.n[0] + 0xffffefffffc2e;
      sStack_120.n[1] = sStack_120.n[1] + 0xfffffffffffff;
      sStack_120.n[2] = sStack_120.n[2] + 0xfffffffffffff;
      sStack_120.n[3] = sStack_120.n[3] + 0xfffffffffffff;
      sStack_120.n[4] = sStack_120.n[4] + 0xffffffffffff;
      sStack_120.normalized = 0;
      sStack_120.magnitude = sStack_120.magnitude + 1;
      pcStack_188 = (code *)0x156285;
      secp256k1_fe_verify(&sStack_120);
      pcStack_188 = (code *)0x15628d;
      secp256k1_fe_verify(&sStack_120);
      uVar6 = (sStack_120.n[4] >> 0x30) * 0x1000003d1 + sStack_120.n[0];
      uVar13 = (uVar6 >> 0x34) + sStack_120.n[1];
      uVar20 = (uVar13 >> 0x34) + sStack_120.n[2];
      psVar21 = (secp256k1_fe *)((uVar20 >> 0x34) + sStack_120.n[3]);
      uVar23 = ((ulong)psVar21 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
      if ((((uVar13 | uVar6 | uVar20 | (ulong)psVar21) & 0xfffffffffffff) != 0 || uVar23 != 0) &&
         (r_01 = (secp256k1_fe *)(uVar23 ^ 0xf000000000000),
         ((uVar6 ^ 0x1000003d0) & uVar13 & uVar20 & (ulong)psVar21 & (ulong)r_01) != 0xfffffffffffff
         )) goto LAB_00156674;
      sStack_150.n[0] = psVar19->n[0];
      sStack_150.n[1] = psVar19->n[1];
      sStack_150.n[2] = psVar19->n[2];
      sStack_150.n[3] = psVar19->n[3];
      sStack_150.n[4] = psVar19->n[4];
      sStack_150.magnitude = psVar19->magnitude;
      sStack_150.normalized = psVar19->normalized;
      psVar19 = &sStack_150;
      pcStack_188 = (code *)0x156333;
      secp256k1_fe_verify(psVar19);
      r_01 = &fe_minus_one;
      pcStack_188 = (code *)0x15633f;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_150.magnitude) goto LAB_00156679;
      sStack_150.n[0] = sStack_150.n[0] + 0xffffefffffc2e;
      sStack_150.n[1] = sStack_150.n[1] + 0xfffffffffffff;
      sStack_150.n[2] = sStack_150.n[2] + 0xfffffffffffff;
      sStack_150.n[3] = sStack_150.n[3] + 0xfffffffffffff;
      sStack_150.n[4] = sStack_150.n[4] + 0xffffffffffff;
      sStack_150.normalized = 0;
      sStack_150.magnitude = sStack_150.magnitude + 1;
      pcStack_188 = (code *)0x15638a;
      secp256k1_fe_verify(&sStack_150);
      pcStack_188 = (code *)0x156392;
      secp256k1_fe_verify(&sStack_150);
      uVar6 = (sStack_150.n[4] >> 0x30) * 0x1000003d1 + sStack_150.n[0];
      if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
        uVar13 = (uVar6 >> 0x34) + sStack_150.n[1];
        uVar20 = (uVar13 >> 0x34) + sStack_150.n[2];
        uVar23 = (uVar20 >> 0x34) + sStack_150.n[3];
        uVar26 = (uVar23 >> 0x34) + (sStack_150.n[4] & 0xffffffffffff);
        if (((uVar13 | uVar6 | uVar20 | uVar23) & 0xfffffffffffff) == 0 && uVar26 == 0) {
          return;
        }
        if (((uVar6 | 0x1000003d0) & uVar13 & uVar20 & uVar23 & (uVar26 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar21 = &sStack_150;
      pcStack_188 = (code *)0x156441;
      (*pcVar32)();
      pcStack_188 = (code *)0x15644c;
      secp256k1_fe_verify(&sStack_180);
      r_01 = &fe_minus_one;
      pcStack_188 = (code *)0x156458;
      secp256k1_fe_verify(&fe_minus_one);
      psVar19 = &sStack_180;
      if (0x1f < sStack_180.magnitude) goto LAB_0015667e;
      sStack_180.n[0] = sStack_180.n[0] + 0xffffefffffc2e;
      sStack_180.n[1] = sStack_180.n[1] + 0xfffffffffffff;
      sStack_180.n[2] = sStack_180.n[2] + 0xfffffffffffff;
      sStack_180.n[3] = sStack_180.n[3] + 0xfffffffffffff;
      sStack_180.n[4] = sStack_180.n[4] + 0xffffffffffff;
      sStack_180.magnitude = sStack_180.magnitude + 1;
      sStack_180.normalized = 0;
      pcStack_188 = (code *)0x1564a1;
      secp256k1_fe_verify(&sStack_180);
      pcStack_188 = (code *)0x1564aa;
      (*pcVar32)(&sStack_180);
      pcStack_188 = (code *)0x1564b2;
      secp256k1_fe_verify(&sStack_180);
      sStack_180.n[0] = sStack_180.n[0] + 1;
      sStack_180.magnitude = sStack_180.magnitude + 1;
      sStack_180.normalized = 0;
      pcStack_188 = (code *)0x1564c4;
      secp256k1_fe_verify(&sStack_180);
      pcStack_188 = (code *)0x1564cc;
      secp256k1_fe_verify(&sStack_180);
      psVar21 = &sStack_150;
      pcStack_188 = (code *)0x1564d9;
      r_01 = psVar21;
      secp256k1_fe_verify(psVar21);
      if (sStack_150.magnitude + sStack_180.magnitude < 0x21) {
        sStack_180.n[0] = sStack_180.n[0] + sStack_150.n[0];
        sStack_180.n[1] = sStack_180.n[1] + sStack_150.n[1];
        sStack_180.n[2] = sStack_180.n[2] + sStack_150.n[2];
        sStack_180.n[3] = sStack_180.n[3] + sStack_150.n[3];
        sStack_180.n[4] = sStack_180.n[4] + sStack_150.n[4];
        sStack_180.normalized = 0;
        pcStack_188 = (code *)0x156525;
        sStack_180.magnitude = sStack_150.magnitude + sStack_180.magnitude;
        secp256k1_fe_verify(&sStack_180);
        pcStack_188 = (code *)0x15652d;
        secp256k1_fe_verify(&sStack_180);
        uVar6 = (sStack_180.n[4] >> 0x30) * 0x1000003d1 + sStack_180.n[0];
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar15 = (uVar6 >> 0x34) + sStack_180.n[1];
          uVar13 = (uVar15 >> 0x34) + sStack_180.n[2];
          uVar20 = (uVar13 >> 0x34) + sStack_180.n[3];
          uVar23 = (uVar20 >> 0x34) + (sStack_180.n[4] & 0xffffffffffff);
          if (((uVar15 | uVar6 | uVar13 | uVar20) & 0xfffffffffffff) == 0 && uVar23 == 0) {
            return;
          }
          if (((uVar6 | 0x1000003d0) & uVar15 & uVar13 & uVar20 & (uVar23 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_188 = (code *)0x1565d6;
        test_inverse_field_cold_2();
        goto LAB_001565d6;
      }
    }
    else {
      pcStack_188 = (code *)0x156674;
      test_inverse_field_cold_7();
LAB_00156674:
      pcStack_188 = (code *)0x156679;
      test_inverse_field_cold_6();
LAB_00156679:
      pcStack_188 = (code *)0x15667e;
      test_inverse_field_cold_5();
LAB_0015667e:
      r_00 = psVar21;
      psVar14 = psVar19;
      psVar21 = &sStack_120;
      pcStack_188 = (code *)0x156683;
      test_inverse_field_cold_4();
    }
    pcStack_188 = (code *)0x156688;
    test_inverse_field_cold_3();
  }
  pcStack_188 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_188 = (code *)0xfffffffffffff;
  psVar19 = (secp256k1_fe *)auStack_1f8;
  pcVar36 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar36 = secp256k1_scalar_inverse;
  }
  pcStack_200 = (code *)0x1566b6;
  auStack_1b8._32_8_ = psVar14;
  auStack_1b8._40_8_ = psVar21;
  (*pcVar36)(auStack_1f8);
  if (r_01 != (secp256k1_fe *)0x0) {
    r_01->n[2] = CONCAT44(auStack_1f8._20_4_,auStack_1f8._16_4_);
    r_01->n[3] = CONCAT44(auStack_1f8._28_4_,auStack_1f8._24_4_);
    r_01->n[0] = CONCAT44(auStack_1f8._4_4_,auStack_1f8._0_4_);
    r_01->n[1] = CONCAT44(auStack_1f8._12_4_,auStack_1f8._8_4_);
  }
  pcStack_200 = (code *)0x1566d5;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  auVar37._0_4_ = -(uint)((int)r_00->n[2] == 0 && (int)r_00->n[0] == 0);
  auVar37._4_4_ = -(uint)(*(int *)((long)r_00->n + 0x14) == 0 && *(int *)((long)r_00->n + 4) == 0);
  auVar37._8_4_ = -(uint)((int)r_00->n[3] == 0 && (int)r_00->n[1] == 0);
  auVar37._12_4_ =
       -(uint)(*(int *)((long)r_00->n + 0x1c) == 0 && *(int *)((long)r_00->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar37);
  if (iVar1 != 0xf) {
    r_01 = (secp256k1_fe *)auStack_1b8;
    pcStack_200 = (code *)0x156709;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_00,(secp256k1_scalar *)auStack_1f8);
    pcStack_200 = (code *)0x156711;
    psVar14 = r_01;
    secp256k1_scalar_verify((secp256k1_scalar *)r_01);
    if (((auStack_1b8._0_8_ != 1 || auStack_1b8._8_8_ != 0) || auStack_1b8._16_8_ != 0) ||
        auStack_1b8._24_8_ != 0) {
      pcStack_200 = (code *)0x15681b;
      test_inverse_scalar_cold_1();
      goto LAB_0015681b;
    }
    pcStack_200 = (code *)0x156741;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_1f8 + 0x20),(secp256k1_scalar *)r_00,&scalar_minus_one);
    pcStack_200 = (code *)0x156749;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1f8 + 0x20));
    auVar38._0_4_ = -(uint)(iStack_1c8 == 0 && auStack_1f8._32_4_ == 0);
    auVar38._4_4_ = -(uint)(iStack_1c4 == 0 && iStack_1d4 == 0);
    auVar38._8_4_ = -(uint)(iStack_1c0 == 0 && iStack_1d0 == 0);
    auVar38._12_4_ = -(uint)(iStack_1bc == 0 && iStack_1cc == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar38);
    if (iVar1 == 0xf) {
      return;
    }
    a_00 = (secp256k1_scalar *)(auStack_1f8 + 0x20);
    pcStack_200 = (code *)0x15677a;
    (*pcVar36)(a_00,a_00);
    pcStack_200 = (code *)0x15678f;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1f8,&scalar_minus_one,(secp256k1_scalar *)auStack_1f8);
    pcStack_200 = (code *)0x156798;
    (*pcVar36)(auStack_1f8,auStack_1f8);
    pcStack_200 = (code *)0x1567aa;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1f8,(secp256k1_scalar *)auStack_1f8,&secp256k1_scalar_one
              );
    pcStack_200 = (code *)0x1567b8;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_1f8,a_00,(secp256k1_scalar *)auStack_1f8);
    pcStack_200 = (code *)0x1567c0;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1f8);
    auVar39._0_4_ = -(uint)(auStack_1f8._16_4_ == 0 && auStack_1f8._0_4_ == 0);
    auVar39._4_4_ = -(uint)(auStack_1f8._20_4_ == 0 && auStack_1f8._4_4_ == 0);
    auVar39._8_4_ = -(uint)(auStack_1f8._24_4_ == 0 && auStack_1f8._8_4_ == 0);
    auVar39._12_4_ = -(uint)(auStack_1f8._28_4_ == 0 && auStack_1f8._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar39);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_200 = (code *)0x1567e4;
    test_inverse_scalar_cold_2();
    r_01 = (secp256k1_fe *)auStack_1f8;
  }
  pcStack_200 = (code *)0x1567ef;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_1f8);
  auVar40._0_4_ = -(uint)(auStack_1f8._16_4_ == 0 && auStack_1f8._0_4_ == 0);
  auVar40._4_4_ = -(uint)(auStack_1f8._20_4_ == 0 && auStack_1f8._4_4_ == 0);
  auVar40._8_4_ = -(uint)(auStack_1f8._24_4_ == 0 && auStack_1f8._8_4_ == 0);
  auVar40._12_4_ = -(uint)(auStack_1f8._28_4_ == 0 && auStack_1f8._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar40);
  r_00 = (secp256k1_fe *)auStack_1f8;
  psVar14 = psVar19;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0015681b:
  pcStack_200 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_218 = 0x1000003d1;
  __s = auStack_12b0;
  psStack_228 = r_00;
  pcStack_220 = pcVar32;
  psStack_210 = r_01;
  pcStack_208 = pcVar36;
  pcStack_200 = (code *)uVar15;
  memset(__s,0,0x1081);
  uStack_12c0 = 0;
  lVar28 = 0x41;
  psStack_12b8 = psVar14;
  secp256k1_hsort(__s,0x41,(size_t)psVar14,test_hsort_cmp,&uStack_12c0);
  if (0x3f < uStack_12c0) {
    test_hsort_is_sorted(auStack_12b0,0x41,(size_t)psVar14);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_12b0,count * (long)psVar14);
        secp256k1_hsort(auStack_12b0,count,(size_t)psVar14,test_hsort_cmp,&uStack_12c0);
        test_hsort_is_sorted(auStack_12b0,count,(size_t)psVar14);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_00 = *extraout_RDX_00 + 1;
  if (extraout_RDX_00[1] != 0) {
    lVar8 = 0;
    do {
      if (__s[lVar8] != *(uchar *)(lVar28 + lVar8)) {
        return;
      }
      lVar8 = lVar8 + 1;
    } while (extraout_RDX_00[1] != lVar8);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_mul_30(secp256k1_modinv32_signed30 *r, const secp256k1_modinv32_signed30 *a, int alen, int32_t factor) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int64_t c = 0;
    int i;
    for (i = 0; i < 8; ++i) {
        if (i < alen) c += (int64_t)a->v[i] * factor;
        r->v[i] = (int32_t)c & M30; c >>= 30;
    }
    if (8 < alen) c += (int64_t)a->v[8] * factor;
    VERIFY_CHECK(c == (int32_t)c);
    r->v[8] = (int32_t)c;
}